

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::OffsetIndex::read(OffsetIndex *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::PageLocation,_true> *this_00;
  pointer plVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  ulong uVar8;
  uint32_t _size160;
  int16_t fid;
  TType _etype163;
  TType ftype;
  ulong local_60;
  OffsetIndex *local_58;
  string fname;
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar2 = (*this_01->_vptr_TProtocol[0x19])(this_01,&fname);
  this_00 = &this->page_locations;
  local_60 = 0;
  local_58 = this;
  do {
    iVar3 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&fname,&ftype,&fid);
    iVar3 = iVar3 + iVar2;
    if (ftype == T_STOP) {
      iVar2 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if ((local_60 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar2 + iVar3);
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar7[1] = puVar7 + 3;
      puVar7[2] = 0;
      *(undefined1 *)(puVar7 + 3) = 0;
      *puVar7 = &PTR__TException_027cc470;
      *(undefined4 *)(puVar7 + 5) = 1;
      __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (fid == 2) {
      if (ftype != T_LIST) {
        iVar4 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_01dd77f0;
      }
      plVar1 = (local_58->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>
               .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((local_58->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
          != plVar1) {
        (local_58->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             plVar1;
      }
      iVar2 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype163,&_size160);
      std::vector<long,_std::allocator<long>_>::resize
                (&(this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>,
                 (ulong)_size160);
      iVar2 = iVar2 + iVar3;
      for (uVar8 = 0; uVar8 < _size160; uVar8 = uVar8 + 1) {
        pvVar6 = duckdb::vector<long,_true>::get<true>(&this->unencoded_byte_array_data_bytes,uVar8)
        ;
        iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,pvVar6);
        iVar2 = iVar2 + iVar3;
      }
      iVar4 = (*this_01->_vptr_TProtocol[0x20])(this_01);
      iVar4 = iVar4 + iVar2;
      local_58->__isset = (_OffsetIndex__isset)((byte)local_58->__isset | 1);
    }
    else {
      if (fid == 1) {
        if (ftype == T_LIST) {
          std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::
          clear(&this_00->
                 super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
               );
          iVar4 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype163,&_size160);
          std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::
          resize(&this_00->
                  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                 ,(ulong)_size160);
          iVar4 = iVar4 + iVar3;
          for (uVar8 = 0; uVar8 < _size160; uVar8 = uVar8 + 1) {
            pvVar5 = duckdb::vector<duckdb_parquet::PageLocation,_true>::get<true>(this_00,uVar8);
            iVar2 = (**(code **)(*(long *)pvVar5 + 0x10))(pvVar5,this_01);
            iVar4 = iVar4 + iVar2;
          }
          iVar2 = (*this_01->_vptr_TProtocol[0x20])(this_01);
          iVar4 = iVar2 + iVar4;
          local_60 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
          goto LAB_01dd77f6;
        }
        iVar4 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
      else {
        iVar4 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
LAB_01dd77f0:
      iVar4 = iVar4 + iVar3;
    }
LAB_01dd77f6:
    iVar2 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar2 = iVar2 + iVar4;
  } while( true );
}

Assistant:

uint32_t OffsetIndex::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_page_locations = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->page_locations.clear();
            uint32_t _size160;
            ::apache::thrift::protocol::TType _etype163;
            xfer += iprot->readListBegin(_etype163, _size160);
            this->page_locations.resize(_size160);
            uint32_t _i164;
            for (_i164 = 0; _i164 < _size160; ++_i164)
            {
              xfer += this->page_locations[_i164].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_page_locations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->unencoded_byte_array_data_bytes.clear();
            uint32_t _size165;
            ::apache::thrift::protocol::TType _etype168;
            xfer += iprot->readListBegin(_etype168, _size165);
            this->unencoded_byte_array_data_bytes.resize(_size165);
            uint32_t _i169;
            for (_i169 = 0; _i169 < _size165; ++_i169)
            {
              xfer += iprot->readI64(this->unencoded_byte_array_data_bytes[_i169]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.unencoded_byte_array_data_bytes = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_page_locations)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}